

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_color.c
# Opt level: O0

swap_palette_t * swap_palette_rgb_get(char *cm)

{
  int iVar1;
  char *in_RDI;
  uchar (*local_8) [3];
  
  if (in_RDI != (char *)0x0) {
    iVar1 = strcmp(in_RDI,"aia171");
    if (iVar1 == 0) {
      local_8 = cm_aia171_rgb;
      return (swap_palette_t *)local_8;
    }
    iVar1 = strcmp(in_RDI,"eui174");
    if (iVar1 == 0) {
      local_8 = cm_eui174_rgb;
      return &local_8;
    }
    iVar1 = strcmp(in_RDI,"eui304");
    if (iVar1 == 0) {
      local_8 = cm_eui304_rgb;
      return &local_8;
    }
    iVar1 = strcmp(in_RDI,"eui1216");
    if (iVar1 == 0) {
      local_8 = cm_eui1216_rgb;
      return &local_8;
    }
    iVar1 = strcmp(in_RDI,"citrus");
    if (iVar1 == 0) {
      local_8 = cm_citrus_rgb;
      return &local_8;
    }
    iVar1 = strcmp(in_RDI,"hot");
    if (iVar1 == 0) {
      local_8 = cm_hot_rgb;
      return &local_8;
    }
    iVar1 = strcmp(in_RDI,"jet");
    if (iVar1 == 0) {
      local_8 = cm_jet_rgb;
      return &local_8;
    }
  }
  return (swap_palette_t *)0x0;
}

Assistant:

swap_palette_t *swap_palette_rgb_get(const char *cm) {
    if (cm) {
        if (!strcmp(cm, "aia171"))
            return &cm_aia171_rgb;
        else if (!strcmp(cm, "eui174"))
            return &cm_eui174_rgb;
        else if (!strcmp(cm, "eui304"))
            return &cm_eui304_rgb;
        else if (!strcmp(cm, "eui1216"))
            return &cm_eui1216_rgb;
        else if (!strcmp(cm, "citrus"))
            return &cm_citrus_rgb;
        else if (!strcmp(cm, "hot"))
            return &cm_hot_rgb;
        else if (!strcmp(cm, "jet"))
/*            for (j = 0; j < 256; ++j) {
                for (i = 0; i < 3; ++i)
                    cmjet_rgb[j][i] = 255 * cmjet[j][i] + .5;
                printf("\t{%d, %d, %d},\n", cmjet_rgb[j][0], cmjet_rgb[j][1], cmjet_rgb[j][2]);
            }
*/
            return &cm_jet_rgb;
    }
    return NULL;
}